

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lmder.c
# Opt level: O3

int lmder(cminpack_funcder_mn fcnder_mn,void *p,int m,int n,double *x,double *fvec,double *fjac,
         int ldfjac,double ftol,double xtol,double gtol,int maxfev,double *diag,int mode,
         double factor,int nprint,int *nfev,int *njev,int *ipvt,double *qtf,double *wa1,double *wa2,
         double *wa3,double *wa4)

{
  bool bVar1;
  bool bVar2;
  cminpack_funcder_mn p_Var3;
  uint uVar4;
  ulong uVar5;
  double *pdVar6;
  double *pdVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  long lVar11;
  ulong uVar12;
  uint uVar13;
  ulong uVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  ulong extraout_XMM0_Qb;
  ulong extraout_XMM0_Qb_00;
  ulong extraout_XMM0_Qb_01;
  ulong extraout_XMM0_Qb_02;
  double dVar20;
  double dVar21;
  double dVar22;
  double par;
  ulong local_148;
  cminpack_funcder_mn local_140;
  double local_138;
  ulong uStack_130;
  double local_128;
  ulong uStack_120;
  double local_118;
  ulong uStack_110;
  double *local_100;
  ulong local_f8;
  double local_f0;
  double local_e8;
  long local_e0;
  double local_d8;
  long local_d0;
  double local_c8;
  undefined8 uStack_c0;
  double local_b8;
  double local_b0;
  double local_a8;
  long local_a0;
  double local_98;
  ulong uStack_90;
  double local_88;
  double local_78;
  double local_68;
  ulong uStack_60;
  double local_58;
  undefined8 uStack_50;
  ulong local_48;
  
  uVar8 = (ulong)(uint)n;
  local_140 = fcnder_mn;
  local_f0 = factor;
  local_e8 = gtol;
  local_d8 = xtol;
  local_88 = ftol;
  dVar15 = dpmpar(1);
  p_Var3 = local_140;
  uVar13 = 0;
  *nfev = 0;
  *njev = 0;
  uVar4 = 0;
  if ((((n <= m && 0 < n) && (uVar4 = uVar13, m <= ldfjac)) && (uVar4 = 0, 0.0 <= local_88)) &&
     (((uVar4 = uVar13, 0.0 <= local_d8 && (0.0 <= local_e8)) && ((0 < maxfev && (0.0 < local_f0))))
     )) {
    if (mode == 2) {
      uVar5 = 0;
      do {
        uVar4 = 0;
        if (diag[uVar5] <= 0.0) goto LAB_00101891;
        uVar5 = uVar5 + 1;
      } while (uVar8 != uVar5);
    }
    local_b0 = dVar15;
    uVar4 = (*local_140)(p,m,n,x,fvec,fjac,ldfjac,1);
    *nfev = 1;
    if (-1 < (int)uVar4) {
      local_128 = enorm(m,fvec);
      par = 0.0;
      uStack_120 = extraout_XMM0_Qb;
      uVar4 = (*p_Var3)(p,m,n,x,fvec,fjac,ldfjac,2);
      *njev = *njev + 1;
      if (-1 < (int)uVar4) {
        local_d0 = (long)m;
        local_f8 = (ulong)(uint)m;
        local_a0 = (long)ldfjac * 8 + 8;
        local_e0 = (long)ldfjac << 3;
        local_148 = 1;
        local_118 = 0.0;
        local_138 = 0.0;
        uStack_130 = 0;
        local_100 = x;
        while( true ) {
          if (((0 < nprint) && (((int)local_148 + -1) % nprint == 0)) &&
             (uVar4 = (*local_140)(p,m,n,x,fvec,fjac,ldfjac,0), (int)uVar4 < 0)) goto LAB_0010189b;
          qrfac(m,n,fjac,ldfjac,1,ipvt,n,wa1,wa2,wa3);
          dVar15 = local_138;
          uVar5 = uStack_130;
          dVar16 = local_118;
          if ((int)local_148 == 1) {
            if (mode != 2) {
              uVar5 = 0;
              do {
                uVar14 = -(ulong)(wa2[uVar5] == 0.0);
                diag[uVar5] = (double)(uVar14 & 0x3ff0000000000000 | ~uVar14 & (ulong)wa2[uVar5]);
                uVar5 = uVar5 + 1;
              } while (uVar8 != uVar5);
            }
            uVar5 = 0;
            do {
              wa3[uVar5] = diag[uVar5] * x[uVar5];
              uVar5 = uVar5 + 1;
            } while (uVar8 != uVar5);
            dVar16 = enorm(n,wa3);
            dVar15 = dVar16 * local_f0;
            uVar5 = extraout_XMM0_Qb_00;
            if ((dVar15 == 0.0) && (!NAN(dVar15))) {
              uVar5 = 0;
              dVar15 = local_f0;
            }
          }
          uVar14 = 0;
          do {
            wa4[uVar14] = fvec[uVar14];
            uVar14 = uVar14 + 1;
          } while (local_f8 != uVar14);
          uVar9 = 0;
          uVar14 = local_f8;
          pdVar6 = wa4;
          pdVar7 = fjac;
          do {
            lVar11 = (long)((int)uVar9 * ldfjac);
            dVar22 = fjac[uVar9 + lVar11];
            if (((dVar22 != 0.0) || (NAN(dVar22))) && ((long)uVar9 < local_d0)) {
              dVar17 = 0.0;
              uVar12 = 0;
              do {
                dVar17 = dVar17 + pdVar7[uVar12] * pdVar6[uVar12];
                uVar12 = uVar12 + 1;
              } while (uVar14 != uVar12);
              if ((long)uVar9 < local_d0) {
                uVar12 = 0;
                do {
                  pdVar6[uVar12] = pdVar7[uVar12] * (-dVar17 / dVar22) + pdVar6[uVar12];
                  uVar12 = uVar12 + 1;
                } while (uVar14 != uVar12);
              }
            }
            fjac[uVar9 + lVar11] = wa1[uVar9];
            qtf[uVar9] = wa4[uVar9];
            uVar9 = uVar9 + 1;
            pdVar7 = (double *)((long)pdVar7 + local_a0);
            pdVar6 = pdVar6 + 1;
            uVar14 = uVar14 - 1;
          } while (uVar9 != uVar8);
          dVar22 = 0.0;
          if ((local_128 != 0.0) || (NAN(local_128))) {
            lVar11 = 1;
            uVar14 = 0;
            pdVar6 = fjac;
            do {
              dVar17 = wa2[(long)ipvt[uVar14] + -1];
              if ((dVar17 != 0.0) || (NAN(dVar17))) {
                dVar18 = 0.0;
                lVar10 = 0;
                do {
                  dVar18 = dVar18 + (qtf[lVar10] / local_128) * pdVar6[lVar10];
                  lVar10 = lVar10 + 1;
                } while (lVar11 != lVar10);
                uVar9 = -(ulong)(ABS(dVar18 / dVar17) <= dVar22);
                dVar22 = (double)(uVar9 & (ulong)dVar22 | ~uVar9 & (ulong)ABS(dVar18 / dVar17));
              }
              uVar14 = uVar14 + 1;
              lVar11 = lVar11 + 1;
              pdVar6 = (double *)((long)pdVar6 + local_e0);
            } while (uVar14 != uVar8);
          }
          if (dVar22 <= local_e8) break;
          if (mode != 2) {
            uVar14 = 0;
            do {
              uVar9 = -(ulong)(wa2[uVar14] <= diag[uVar14]);
              diag[uVar14] = (double)(~uVar9 & (ulong)wa2[uVar14] | (ulong)diag[uVar14] & uVar9);
              uVar14 = uVar14 + 1;
            } while (uVar8 != uVar14);
          }
          uStack_c0 = 0;
          local_118 = dVar16;
          local_c8 = dVar22;
          do {
            local_138 = dVar15;
            uStack_130 = uVar5;
            lmpar(n,fjac,ldfjac,ipvt,diag,qtf,dVar15,&par,wa1,wa2,wa3,wa4);
            uVar5 = 0;
            do {
              dVar15 = wa1[uVar5];
              wa1[uVar5] = -dVar15;
              wa2[uVar5] = x[uVar5] - dVar15;
              wa3[uVar5] = diag[uVar5] * wa1[uVar5];
              uVar5 = uVar5 + 1;
            } while (uVar8 != uVar5);
            local_98 = enorm(n,wa3);
            if ((int)local_148 == 1) {
              local_138 = (double)(-(ulong)(local_138 <= local_98) & (ulong)local_138 |
                                  ~-(ulong)(local_138 <= local_98) & (ulong)local_98);
              uStack_130 = uStack_130 | ~uStack_130 & extraout_XMM0_Qb_01;
            }
            uStack_90 = extraout_XMM0_Qb_01;
            uVar4 = (*local_140)(p,m,n,wa2,wa4,fjac,ldfjac,1);
            *nfev = *nfev + 1;
            x = local_100;
            if ((int)uVar4 < 0) goto LAB_00101891;
            local_a8 = enorm(m,wa4);
            local_78 = local_a8 * 0.1;
            local_58 = 1.0 - (local_a8 / local_128) * (local_a8 / local_128);
            local_48 = -(ulong)(local_78 < local_128);
            uStack_50 = 0;
            local_68 = (double)(~local_48 & 0xbff0000000000000 | local_48 & (ulong)local_58);
            lVar11 = 1;
            uVar5 = 0;
            pdVar6 = fjac;
            do {
              wa3[uVar5] = 0.0;
              dVar15 = wa1[(long)ipvt[uVar5] + -1];
              lVar10 = 0;
              do {
                wa3[lVar10] = pdVar6[lVar10] * dVar15 + wa3[lVar10];
                lVar10 = lVar10 + 1;
              } while (lVar11 != lVar10);
              uVar5 = uVar5 + 1;
              lVar11 = lVar11 + 1;
              pdVar6 = (double *)((long)pdVar6 + local_e0);
            } while (uVar5 != uVar8);
            uStack_60 = 0;
            dVar15 = enorm(n,wa3);
            if (par < 0.0) {
              local_b8 = dVar15;
              dVar16 = sqrt(par);
              dVar15 = local_b8;
              uVar14 = extraout_XMM0_Qb_02;
            }
            else {
              dVar16 = SQRT(par);
              uVar14 = 0;
            }
            x = local_100;
            dVar17 = (dVar16 * local_98) / local_128;
            dVar17 = dVar17 * dVar17;
            dVar15 = (dVar15 / local_128) * (dVar15 / local_128);
            dVar22 = dVar17 + dVar17 + dVar15;
            dVar16 = (double)(-(ulong)(dVar22 != 0.0) & (ulong)(local_68 / dVar22));
            if (dVar16 <= 0.25) {
              dVar15 = dVar15 + dVar17;
              dVar15 = (double)(~-(ulong)(local_68 < 0.0) & 0x3fe0000000000000 |
                               (ulong)((dVar15 * -0.5) / (local_68 * 0.5 - dVar15)) &
                               -(ulong)(local_68 < 0.0));
              dVar17 = 0.1;
              if (local_78 < local_128 && 0.1 <= dVar15) {
                dVar17 = dVar15;
              }
              uVar9 = -(ulong)(local_138 <= local_98 / 0.1);
              uVar5 = uStack_130 | ~uStack_130 & uStack_90;
              dVar15 = (double)(uVar9 & (ulong)local_138 | ~uVar9 & (ulong)(local_98 / 0.1)) *
                       dVar17;
              par = par / dVar17;
            }
            else if ((0.75 <= dVar16) ||
                    ((dVar15 = local_138, uVar5 = uStack_130, par == 0.0 && (!NAN(par))))) {
              dVar15 = local_98 + local_98;
              par = par * 0.5;
              uVar5 = uStack_90;
            }
            dVar17 = local_128;
            uVar9 = uStack_120;
            dVar18 = local_118;
            if (0.0001 <= dVar16) {
              uVar9 = 0;
              do {
                dVar17 = wa2[uVar9];
                local_100[uVar9] = dVar17;
                wa2[uVar9] = dVar17 * diag[uVar9];
                uVar9 = uVar9 + 1;
              } while (uVar8 != uVar9);
              uVar9 = 0;
              do {
                fvec[uVar9] = wa4[uVar9];
                uVar9 = uVar9 + 1;
              } while (local_f8 != uVar9);
              local_138 = dVar15;
              uStack_130 = uVar5;
              local_128 = dVar16;
              uStack_120 = uVar14 & uStack_60;
              local_118 = dVar22;
              uStack_110 = uVar14;
              dVar18 = enorm(n,wa2);
              local_148 = (ulong)((int)local_148 + 1);
              uVar9 = 0;
              dVar17 = local_a8;
              dVar15 = local_138;
              uVar5 = uStack_130;
              dVar16 = local_128;
              dVar22 = local_118;
            }
            dVar21 = (double)(~local_48 & 0x3ff0000000000000 | (ulong)ABS(local_58) & local_48);
            bVar1 = local_88 < dVar21;
            bVar2 = local_88 < dVar22;
            dVar19 = dVar16 * 0.5;
            dVar20 = dVar18 * local_d8;
            if (((!bVar2 && !bVar1) && (dVar19 <= 1.0)) && (dVar15 <= dVar20)) {
              uVar4 = 3;
              goto LAB_00101891;
            }
            if (((!bVar2 && !bVar1) && 1.0 >= dVar19) || (dVar15 <= dVar20)) {
              uVar4 = 2;
              if (dVar20 < dVar15) {
                uVar4 = (byte)~((bVar2 || bVar1) || 1.0 < dVar19) & 1;
              }
              goto LAB_00101891;
            }
            uVar13 = (uint)(maxfev <= *nfev) * 5;
            uVar4 = 6;
            if (1.0 < dVar19) {
              uVar4 = uVar13;
            }
            if (local_b0 < dVar22) {
              uVar4 = uVar13;
            }
            if (local_b0 < dVar21) {
              uVar4 = uVar13;
            }
            if (dVar15 <= local_b0 * dVar18) {
              uVar4 = 7;
            }
            if (local_c8 <= local_b0) {
              uVar4 = 8;
            }
            if (uVar4 != 0) goto LAB_00101891;
            local_128 = dVar17;
            uStack_120 = uVar9;
            local_118 = dVar18;
          } while (dVar16 < 0.0001);
          local_138 = dVar15;
          uStack_130 = uVar5;
          uVar4 = (*local_140)(p,m,n,x,fvec,fjac,ldfjac,2);
          *njev = *njev + 1;
          if ((int)uVar4 < 0) goto LAB_00101891;
        }
        uVar4 = 4;
      }
    }
  }
LAB_00101891:
  if (0 < nprint) {
LAB_0010189b:
    (*local_140)(p,m,n,x,fvec,fjac,ldfjac,0);
  }
  return uVar4;
}

Assistant:

__cminpack_attr__
int __cminpack_func__(lmder)(__cminpack_decl_fcnder_mn__ void *p, int m, int n, real *x, 
	real *fvec, real *fjac, int ldfjac, real ftol,
	real xtol, real gtol, int maxfev, real *
	diag, int mode, real factor, int nprint,
	int *nfev, int *njev, int *ipvt, real *qtf, 
	real *wa1, real *wa2, real *wa3, real *wa4)
{
    /* Initialized data */

#define p1 ((real).1)
#define p5 ((real).5)
#define p25 ((real).25)
#define p75 .75
#define p0001 1e-4

    /* System generated locals */
    real d1, d2;

    /* Local variables */
    int i, j, l;
    real par, sum;
    int iter;
    real temp, temp1, temp2;
    int iflag;
    real delta = 0.;
    real ratio;
    real fnorm, gnorm, pnorm, xnorm = 0., fnorm1, actred, dirder, 
	    epsmch, prered;
    int info;

/*     ********** */

/*     subroutine lmder */

/*     the purpose of lmder is to minimize the sum of the squares of */
/*     m nonlinear functions in n variables by a modification of */
/*     the levenberg-marquardt algorithm. the user must provide a */
/*     subroutine which calculates the functions and the jacobian. */

/*     the subroutine statement is */

/*       subroutine lmder(fcn,m,n,x,fvec,fjac,ldfjac,ftol,xtol,gtol, */
/*                        maxfev,diag,mode,factor,nprint,info,nfev, */
/*                        njev,ipvt,qtf,wa1,wa2,wa3,wa4) */

/*     where */

/*       fcn is the name of the user-supplied subroutine which */
/*         calculates the functions and the jacobian. fcn must */
/*         be declared in an external statement in the user */
/*         calling program, and should be written as follows. */

/*         subroutine fcn(m,n,x,fvec,fjac,ldfjac,iflag) */
/*         integer m,n,ldfjac,iflag */
/*         double precision x(n),fvec(m),fjac(ldfjac,n) */
/*         ---------- */
/*         if iflag = 1 calculate the functions at x and */
/*         return this vector in fvec. do not alter fjac. */
/*         if iflag = 2 calculate the jacobian at x and */
/*         return this matrix in fjac. do not alter fvec. */
/*         ---------- */
/*         return */
/*         end */

/*         the value of iflag should not be changed by fcn unless */
/*         the user wants to terminate execution of lmder. */
/*         in this case set iflag to a negative integer. */

/*       m is a positive integer input variable set to the number */
/*         of functions. */

/*       n is a positive integer input variable set to the number */
/*         of variables. n must not exceed m. */

/*       x is an array of length n. on input x must contain */
/*         an initial estimate of the solution vector. on output x */
/*         contains the final estimate of the solution vector. */

/*       fvec is an output array of length m which contains */
/*         the functions evaluated at the output x. */

/*       fjac is an output m by n array. the upper n by n submatrix */
/*         of fjac contains an upper triangular matrix r with */
/*         diagonal elements of nonincreasing magnitude such that */

/*                t     t           t */
/*               p *(jac *jac)*p = r *r, */

/*         where p is a permutation matrix and jac is the final */
/*         calculated jacobian. column j of p is column ipvt(j) */
/*         (see below) of the identity matrix. the lower trapezoidal */
/*         part of fjac contains information generated during */
/*         the computation of r. */

/*       ldfjac is a positive integer input variable not less than m */
/*         which specifies the leading dimension of the array fjac. */

/*       ftol is a nonnegative input variable. termination */
/*         occurs when both the actual and predicted relative */
/*         reductions in the sum of squares are at most ftol. */
/*         therefore, ftol measures the relative error desired */
/*         in the sum of squares. */

/*       xtol is a nonnegative input variable. termination */
/*         occurs when the relative error between two consecutive */
/*         iterates is at most xtol. therefore, xtol measures the */
/*         relative error desired in the approximate solution. */

/*       gtol is a nonnegative input variable. termination */
/*         occurs when the cosine of the angle between fvec and */
/*         any column of the jacobian is at most gtol in absolute */
/*         value. therefore, gtol measures the orthogonality */
/*         desired between the function vector and the columns */
/*         of the jacobian. */

/*       maxfev is a positive integer input variable. termination */
/*         occurs when the number of calls to fcn with iflag = 1 */
/*         has reached maxfev. */

/*       diag is an array of length n. if mode = 1 (see */
/*         below), diag is internally set. if mode = 2, diag */
/*         must contain positive entries that serve as */
/*         multiplicative scale factors for the variables. */

/*       mode is an integer input variable. if mode = 1, the */
/*         variables will be scaled internally. if mode = 2, */
/*         the scaling is specified by the input diag. other */
/*         values of mode are equivalent to mode = 1. */

/*       factor is a positive input variable used in determining the */
/*         initial step bound. this bound is set to the product of */
/*         factor and the euclidean norm of diag*x if nonzero, or else */
/*         to factor itself. in most cases factor should lie in the */
/*         interval (.1,100.).100. is a generally recommended value. */

/*       nprint is an integer input variable that enables controlled */
/*         printing of iterates if it is positive. in this case, */
/*         fcn is called with iflag = 0 at the beginning of the first */
/*         iteration and every nprint iterations thereafter and */
/*         immediately prior to return, with x, fvec, and fjac */
/*         available for printing. fvec and fjac should not be */
/*         altered. if nprint is not positive, no special calls */
/*         of fcn with iflag = 0 are made. */

/*       info is an integer output variable. if the user has */
/*         terminated execution, info is set to the (negative) */
/*         value of iflag. see description of fcn. otherwise, */
/*         info is set as follows. */

/*         info = 0  improper input parameters. */

/*         info = 1  both actual and predicted relative reductions */
/*                   in the sum of squares are at most ftol. */

/*         info = 2  relative error between two consecutive iterates */
/*                   is at most xtol. */

/*         info = 3  conditions for info = 1 and info = 2 both hold. */

/*         info = 4  the cosine of the angle between fvec and any */
/*                   column of the jacobian is at most gtol in */
/*                   absolute value. */

/*         info = 5  number of calls to fcn with iflag = 1 has */
/*                   reached maxfev. */

/*         info = 6  ftol is too small. no further reduction in */
/*                   the sum of squares is possible. */

/*         info = 7  xtol is too small. no further improvement in */
/*                   the approximate solution x is possible. */

/*         info = 8  gtol is too small. fvec is orthogonal to the */
/*                   columns of the jacobian to machine precision. */

/*       nfev is an integer output variable set to the number of */
/*         calls to fcn with iflag = 1. */

/*       njev is an integer output variable set to the number of */
/*         calls to fcn with iflag = 2. */

/*       ipvt is an integer output array of length n. ipvt */
/*         defines a permutation matrix p such that jac*p = q*r, */
/*         where jac is the final calculated jacobian, q is */
/*         orthogonal (not stored), and r is upper triangular */
/*         with diagonal elements of nonincreasing magnitude. */
/*         column j of p is column ipvt(j) of the identity matrix. */

/*       qtf is an output array of length n which contains */
/*         the first n elements of the vector (q transpose)*fvec. */

/*       wa1, wa2, and wa3 are work arrays of length n. */

/*       wa4 is a work array of length m. */

/*     subprograms called */

/*       user-supplied ...... fcn */

/*       minpack-supplied ... dpmpar,enorm,lmpar,qrfac */

/*       fortran-supplied ... dabs,dmax1,dmin1,dsqrt,mod */

/*     argonne national laboratory. minpack project. march 1980. */
/*     burton s. garbow, kenneth e. hillstrom, jorge j. more */

/*     ********** */

/*     epsmch is the machine precision. */

    epsmch = __cminpack_func__(dpmpar)(1);

    info = 0;
    iflag = 0;
    *nfev = 0;
    *njev = 0;

/*     check the input parameters for errors. */

    if (n <= 0 || m < n || ldfjac < m || ftol < 0. || xtol < 0. || 
	    gtol < 0. || maxfev <= 0 || factor <= 0.) {
	goto TERMINATE;
    }
    if (mode == 2) {
        for (j = 0; j < n; ++j) {
            if (diag[j] <= 0.) {
                goto TERMINATE;
            }
        }
    }

/*     evaluate the function at the starting point */
/*     and calculate its norm. */

    iflag = fcnder_mn(p, m, n, x, fvec, fjac, ldfjac, 1);
    *nfev = 1;
    if (iflag < 0) {
	goto TERMINATE;
    }
    fnorm = __cminpack_func__(enorm)(m, fvec);

/*     initialize levenberg-marquardt parameter and iteration counter. */

    par = 0.;
    iter = 1;

/*     beginning of the outer loop. */

    for (;;) {

/*        calculate the jacobian matrix. */

        iflag = fcnder_mn(p, m, n, x, fvec, fjac, ldfjac, 2);
        ++(*njev);
        if (iflag < 0) {
            goto TERMINATE;
        }

/*        if requested, call fcn to enable printing of iterates. */

        if (nprint > 0) {
            iflag = 0;
            if ((iter - 1) % nprint == 0) {
                iflag = fcnder_mn(p, m, n, x, fvec, fjac, ldfjac, 0);
            }
            if (iflag < 0) {
                goto TERMINATE;
            }
        }

/*        compute the qr factorization of the jacobian. */

        __cminpack_func__(qrfac)(m, n, fjac, ldfjac, TRUE_, ipvt, n,
              wa1, wa2, wa3);

/*        on the first iteration and if mode is 1, scale according */
/*        to the norms of the columns of the initial jacobian. */

        if (iter == 1) {
            if (mode != 2) {
                for (j = 0; j < n; ++j) {
                    diag[j] = wa2[j];
                    if (wa2[j] == 0.) {
                        diag[j] = 1.;
                    }
                }
            }

/*        on the first iteration, calculate the norm of the scaled x */
/*        and initialize the step bound delta. */

            for (j = 0; j < n; ++j) {
                wa3[j] = diag[j] * x[j];
            }
            xnorm = __cminpack_func__(enorm)(n, wa3);
            delta = factor * xnorm;
            if (delta == 0.) {
                delta = factor;
            }
        }

/*        form (q transpose)*fvec and store the first n components in */
/*        qtf. */

        for (i = 0; i < m; ++i) {
            wa4[i] = fvec[i];
        }
        for (j = 0; j < n; ++j) {
            if (fjac[j + j * ldfjac] != 0.) {
                sum = 0.;
                for (i = j; i < m; ++i) {
                    sum += fjac[i + j * ldfjac] * wa4[i];
                }
                temp = -sum / fjac[j + j * ldfjac];
                for (i = j; i < m; ++i) {
                    wa4[i] += fjac[i + j * ldfjac] * temp;
                }
            }
            fjac[j + j * ldfjac] = wa1[j];
            qtf[j] = wa4[j];
        }

/*        compute the norm of the scaled gradient. */

        gnorm = 0.;
        if (fnorm != 0.) {
            for (j = 0; j < n; ++j) {
                l = ipvt[j]-1;
                if (wa2[l] != 0.) {
                    sum = 0.;
                    for (i = 0; i <= j; ++i) {
                        sum += fjac[i + j * ldfjac] * (qtf[i] / fnorm);
                    }
                    /* Computing MAX */
                    d1 = fabs(sum / wa2[l]);
                    gnorm = max(gnorm,d1);
                }
            }
        }

/*        test for convergence of the gradient norm. */

        if (gnorm <= gtol) {
            info = 4;
        }
        if (info != 0) {
            goto TERMINATE;
        }

/*        rescale if necessary. */

        if (mode != 2) {
            for (j = 0; j < n; ++j) {
                /* Computing MAX */
                d1 = diag[j], d2 = wa2[j];
                diag[j] = max(d1,d2);
            }
        }

/*        beginning of the inner loop. */

        do {

/*           determine the levenberg-marquardt parameter. */

            __cminpack_func__(lmpar)(n, fjac, ldfjac, ipvt, diag, qtf, delta,
                  &par, wa1, wa2, wa3, wa4);

/*           store the direction p and x + p. calculate the norm of p. */

            for (j = 0; j < n; ++j) {
                wa1[j] = -wa1[j];
                wa2[j] = x[j] + wa1[j];
                wa3[j] = diag[j] * wa1[j];
            }
            pnorm = __cminpack_func__(enorm)(n, wa3);

/*           on the first iteration, adjust the initial step bound. */

            if (iter == 1) {
                delta = min(delta,pnorm);
            }

/*           evaluate the function at x + p and calculate its norm. */

            iflag = fcnder_mn(p, m, n, wa2, wa4, fjac, ldfjac, 1);
            ++(*nfev);
            if (iflag < 0) {
                goto TERMINATE;
            }
            fnorm1 = __cminpack_func__(enorm)(m, wa4);

/*           compute the scaled actual reduction. */

            actred = -1.;
            if (p1 * fnorm1 < fnorm) {
                /* Computing 2nd power */
                d1 = fnorm1 / fnorm;
                actred = 1 - d1 * d1;
            }

/*           compute the scaled predicted reduction and */
/*           the scaled directional derivative. */

            for (j = 0; j < n; ++j) {
                wa3[j] = 0.;
                l = ipvt[j]-1;
                temp = wa1[l];
                for (i = 0; i <= j; ++i) {
                    wa3[i] += fjac[i + j * ldfjac] * temp;
                }
            }
            temp1 = __cminpack_func__(enorm)(n, wa3) / fnorm;
            temp2 = (sqrt(par) * pnorm) / fnorm;
            prered = temp1 * temp1 + temp2 * temp2 / p5;
            dirder = -(temp1 * temp1 + temp2 * temp2);

/*           compute the ratio of the actual to the predicted */
/*           reduction. */

            ratio = 0.;
            if (prered != 0.) {
                ratio = actred / prered;
            }

/*           update the step bound. */

            if (ratio <= p25) {
                if (actred >= 0.) {
                    temp = p5;
                } else {
                    temp = p5 * dirder / (dirder + p5 * actred);
                }
                if (p1 * fnorm1 >= fnorm || temp < p1) {
                    temp = p1;
                }
                /* Computing MIN */
                d1 = pnorm / p1;
                delta = temp * min(delta,d1);
                par /= temp;
            } else {
                if (par == 0. || ratio >= p75) {
                    delta = pnorm / p5;
                    par = p5 * par;
                }
            }

/*           test for successful iteration. */

            if (ratio >= p0001) {

/*           successful iteration. update x, fvec, and their norms. */

                for (j = 0; j < n; ++j) {
                    x[j] = wa2[j];
                    wa2[j] = diag[j] * x[j];
                }
                for (i = 0; i < m; ++i) {
                    fvec[i] = wa4[i];
                }
                xnorm = __cminpack_func__(enorm)(n, wa2);
                fnorm = fnorm1;
                ++iter;
            }

/*           tests for convergence. */

            if (fabs(actred) <= ftol && prered <= ftol && p5 * ratio <= 1.) {
                info = 1;
            }
            if (delta <= xtol * xnorm) {
                info = 2;
            }
            if (fabs(actred) <= ftol && prered <= ftol && p5 * ratio <= 1. && info == 2) {
                info = 3;
            }
            if (info != 0) {
                goto TERMINATE;
            }

/*           tests for termination and stringent tolerances. */

            if (*nfev >= maxfev) {
                info = 5;
            }
            if (fabs(actred) <= epsmch && prered <= epsmch && p5 * ratio <= 1.) {
                info = 6;
            }
            if (delta <= epsmch * xnorm) {
                info = 7;
            }
            if (gnorm <= epsmch) {
                info = 8;
            }
            if (info != 0) {
                goto TERMINATE;
            }

/*           end of the inner loop. repeat if iteration unsuccessful. */

        } while (ratio < p0001);

/*        end of the outer loop. */

    }
TERMINATE:

/*     termination, either normal or user imposed. */

    if (iflag < 0) {
	info = iflag;
    }
    if (nprint > 0) {
	fcnder_mn(p, m, n, x, fvec, fjac, ldfjac, 0);
    }
    return info;

/*     last card of subroutine lmder. */

}